

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blns.cpp
# Opt level: O3

void blns::Blns::readFile(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  istream *piVar3;
  long lVar4;
  string line;
  ifstream blnsFile;
  path local_368;
  path local_340;
  path local_318;
  path local_2f0;
  path local_2c8;
  path local_2a0;
  path local_278;
  path local_250;
  long local_228 [65];
  
  std::filesystem::__cxx11::path::path<char[88],std::filesystem::__cxx11::path>
            (&local_250,
             (char (*) [88])
             "/workspace/llm4binary/github/license_c_cmakelists/eliabieri[P]blnscpp/src/blns/blns.cpp"
             ,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
            (&local_2f0,(char (*) [3])"..",auto_format);
  std::filesystem::__cxx11::operator/(&local_2a0,&local_2c8,&local_2f0);
  std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
            (&local_318,(char (*) [3])"..",auto_format);
  std::filesystem::__cxx11::operator/(&local_278,&local_2a0,&local_318);
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            (&local_340,(char (*) [9])"blns.txt",auto_format);
  std::filesystem::__cxx11::operator/(&local_368,&local_278,&local_340);
  std::ifstream::ifstream((istream *)local_228,local_368._M_pathname._M_dataplus._M_p,_S_in);
  std::filesystem::__cxx11::path::~path(&local_368);
  std::filesystem::__cxx11::path::~path(&local_340);
  std::filesystem::__cxx11::path::~path(&local_278);
  std::filesystem::__cxx11::path::~path(&local_318);
  std::filesystem::__cxx11::path::~path(&local_2a0);
  std::filesystem::__cxx11::path::~path(&local_2f0);
  std::filesystem::__cxx11::path::~path(&local_2c8);
  std::filesystem::__cxx11::path::~path(&local_250);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    __assert_fail("blnsFile.is_open()",
                  "/workspace/llm4binary/github/license_c_cmakelists/eliabieri[P]blnscpp/src/blns/blns.cpp"
                  ,0x15,"static void blns::Blns::readFile()");
  }
  paVar1 = &local_368._M_pathname.field_2;
  local_368._M_pathname._M_string_length = 0;
  local_368._M_pathname.field_2._M_local_buf[0] = '\0';
  local_368._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_228[0] + -0x18) + (char)(istream *)local_228
                           );
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_228,(string *)&local_368,cVar2);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    if (local_368._M_pathname._M_string_length != 0) {
      lVar4 = std::__cxx11::string::rfind((char)&local_368,0x23);
      if (lVar4 != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&s_blns_abi_cxx11_,&local_368._M_pathname);
      }
    }
  }
  if (s_blns_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      s_blns_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_368._M_pathname._M_dataplus._M_p,
                      CONCAT71(local_368._M_pathname.field_2._M_allocated_capacity._1_7_,
                               local_368._M_pathname.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(local_228);
    return;
  }
  __assert_fail("!s_blns.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/eliabieri[P]blnscpp/src/blns/blns.cpp"
                ,0x1e,"static void blns::Blns::readFile()");
}

Assistant:

void blns::Blns::readFile() {
    std::ifstream blnsFile = std::filesystem::path(__FILE__).parent_path()
                             / ".." / ".." / "blns.txt";

    // If this assertion fails, ensure that you have correctly
    // downloaded blns.txt at the root of the project during cmake build
    assert(blnsFile.is_open());

    std::string line;
    while(getline(blnsFile, line)) {
        // Skip comments in txt file
        if(!line.empty() && line.rfind('#', 0) != 0) {
            s_blns.push_back(line);
        }
    }
    assert(!s_blns.empty());
}